

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::ipc::ClientImpl::~ClientImpl(ClientImpl *this)

{
  ClientImpl *this_local;
  
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__ClientImpl_009c38d8;
  (this->super_EventListener)._vptr_EventListener = (_func_int **)&DAT_009c3928;
  (*(this->super_Client)._vptr_Client[6])(this,0);
  perfetto::base::WeakPtrFactory<perfetto::ipc::Client>::~WeakPtrFactory(&this->weak_ptr_factory_);
  std::__cxx11::
  list<perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>,_std::allocator<perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>_>
  ::~list(&this->queued_bindings_);
  std::
  map<unsigned_int,_perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>_>_>
  ::~map(&this->service_bindings_);
  std::
  map<unsigned_long,_perfetto::ipc::ClientImpl::QueuedRequest,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::ipc::ClientImpl::QueuedRequest>_>_>
  ::~map(&this->queued_requests_);
  perfetto::base::
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::~ScopedResource(&this->received_fd_);
  BufferedFrameDeserializer::~BufferedFrameDeserializer(&this->frame_deserializer_);
  std::unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
  ~unique_ptr(&this->sock_);
  perfetto::base::UnixSocket::EventListener::~EventListener(&this->super_EventListener);
  Client::~Client(&this->super_Client);
  return;
}

Assistant:

ClientImpl::~ClientImpl() {
  // Ensure we are not destroyed in the middle of invoking a reply.
  PERFETTO_DCHECK(!invoking_method_reply_);
  OnDisconnect(
      nullptr);  // The base::UnixSocket* ptr is not used in OnDisconnect().
}